

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_usadd8_aarch64(void *d,void *a,void *b,uint32_t desc)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = 0;
  do {
    uVar2 = (uint)*(byte *)((long)b + uVar4) + (uint)*(byte *)((long)a + uVar4);
    uVar1 = (undefined1)uVar2;
    if (0xfe < uVar2) {
      uVar1 = 0xff;
    }
    *(undefined1 *)((long)d + uVar4) = uVar1;
    uVar4 = uVar4 + 1;
  } while (uVar3 + 8 != uVar4);
  if (uVar3 < (desc >> 2 & 0xf8)) {
    helper_gvec_usadd8_aarch64_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_usadd8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        unsigned r = *(uint8_t *)((char *)a + i) + *(uint8_t *)((char *)b + i);
        if (r > UINT8_MAX) {
            r = UINT8_MAX;
        }
        *(uint8_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}